

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O2

ExpressionValue * __thiscall
ExpressionValue::operator&&
          (ExpressionValue *__return_storage_ptr__,ExpressionValue *this,ExpressionValue *other)

{
  anon_union_8_2_b358304e_for_ExpressionValue_1 aVar1;
  ExpressionValue *result;
  ulong uVar2;
  
  (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
  (__return_storage_ptr__->strValue)._value._M_string_length = 0;
  (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->field_1).intValue = 0;
  __return_storage_ptr__->type = Integer;
  switch(this->type << 2 | other->type) {
  case 5:
    aVar1.intValue._1_7_ = 0;
    aVar1.intValue._0_1_ = (other->field_1).intValue != 0 && (this->field_1).intValue != 0;
    __return_storage_ptr__->field_1 = aVar1;
    return __return_storage_ptr__;
  case 6:
    uVar2 = 0;
    if ((this->field_1).intValue != 0) {
      uVar2 = -(ulong)((other->field_1).floatValue != 0.0) & 0x3ff0000000000000;
    }
    (__return_storage_ptr__->field_1).intValue = uVar2;
    return __return_storage_ptr__;
  default:
    goto switchD_001699f4_caseD_7;
  case 9:
    if ((other->field_1).intValue == 0) {
      uVar2 = 0;
    }
    else {
      uVar2 = 0x3ff0000000000000;
    }
    uVar2 = -(ulong)((this->field_1).floatValue != 0.0) & uVar2;
    break;
  case 10:
    uVar2 = -(ulong)((this->field_1).floatValue != 0.0) &
            -(ulong)((other->field_1).floatValue != 0.0) & 0x3ff0000000000000;
  }
  (__return_storage_ptr__->field_1).intValue = uVar2;
switchD_001699f4_caseD_7:
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue ExpressionValue::operator&&(const ExpressionValue& other) const
{
	ExpressionValue result;
	result.type = ExpressionValueType::Integer;

	switch (getValueCombination(type,other.type))
	{
	case ExpressionValueCombination::II:
		result.intValue = intValue && other.intValue;
		break;
	case ExpressionValueCombination::FI:
		result.floatValue = floatValue && other.intValue;
		break;
	case ExpressionValueCombination::IF:
		result.floatValue = intValue && other.floatValue;
		break;
	case ExpressionValueCombination::FF:
		result.floatValue = floatValue && other.floatValue;
		break;
	default:
		break;
	}

	return result;
}